

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

uint32_t bech32_polymod_step(uint32_t pre)

{
  return (int)(pre * 4) >> 0x1f & 0x2a1462b3U ^ (int)(pre * 8) >> 0x1f & 0x3d4233ddU ^
         (int)(pre << 4) >> 0x1f & 0x1ea119faU ^ (int)(pre << 5) >> 0x1f & 0x26508e6dU ^
         (int)(pre << 6) >> 0x1f & 0x3b6a57b2U ^ pre << 5 & 0x3fffffe0;
}

Assistant:

static uint32_t bech32_polymod_step(uint32_t pre) {
    uint8_t b = pre >> 25;
    return ((pre & 0x1FFFFFF) << 5) ^
           (-((b >> 0) & 1) & 0x3b6a57b2UL) ^
           (-((b >> 1) & 1) & 0x26508e6dUL) ^
           (-((b >> 2) & 1) & 0x1ea119faUL) ^
           (-((b >> 3) & 1) & 0x3d4233ddUL) ^
           (-((b >> 4) & 1) & 0x2a1462b3UL);
}